

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleParallelAnalyzerSettings.cpp
# Opt level: O3

char * __thiscall SimpleParallelAnalyzerSettings::SaveSettings(SimpleParallelAnalyzerSettings *this)

{
  ulong uVar1;
  char *pcVar2;
  long lVar3;
  SimpleArchive text_archive;
  SimpleArchive aSStack_28 [8];
  
  SimpleArchive::SimpleArchive(aSStack_28);
  uVar1 = (ulong)((long)(this->mDataChannels).super__Vector_base<Channel,_std::allocator<Channel>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->mDataChannels).super__Vector_base<Channel,_std::allocator<Channel>_>.
                       _M_impl.super__Vector_impl_data._M_start) >> 4;
  if ((int)uVar1 != 0) {
    uVar1 = uVar1 & 0xffffffff;
    lVar3 = 0;
    do {
      SimpleArchive::operator<<
                (aSStack_28,
                 (this->mDataChannels).super__Vector_base<Channel,_std::allocator<Channel>_>._M_impl
                 .super__Vector_impl_data._M_start + lVar3);
      lVar3 = lVar3 + 0x10;
      uVar1 = uVar1 - 1;
    } while (uVar1 != 0);
  }
  SimpleArchive::operator<<(aSStack_28,&this->mClockChannel);
  SimpleArchive::operator<<(aSStack_28,this->mClockEdge);
  SimpleArchive::GetString();
  pcVar2 = (char *)AnalyzerSettings::SetReturnString((char *)this);
  SimpleArchive::~SimpleArchive(aSStack_28);
  return pcVar2;
}

Assistant:

const char* SimpleParallelAnalyzerSettings::SaveSettings()
{
    SimpleArchive text_archive;

    U32 count = mDataChannels.size();

    for( U32 i = 0; i < count; i++ )
    {
        text_archive << mDataChannels[ i ];
    }

    text_archive << mClockChannel;
    U32 edge = static_cast<U32>( mClockEdge );
    text_archive << edge;

    return SetReturnString( text_archive.GetString() );
}